

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unistr_cnv.cpp
# Opt level: O0

void __thiscall
icu_63::UnicodeString::doCodepageCreate
          (UnicodeString *this,char *codepageData,int32_t dataLength,char *codepage)

{
  char cVar1;
  char *cs;
  UBool UVar2;
  size_t sVar3;
  char16_t *us;
  StringPiece utf8;
  undefined1 local_50 [12];
  char *local_40;
  char *defaultName;
  UConverter *converter;
  char *pcStack_28;
  UErrorCode status;
  char *codepage_local;
  char *pcStack_18;
  int32_t dataLength_local;
  char *codepageData_local;
  UnicodeString *this_local;
  
  if (codepageData == (char *)0x0) {
    return;
  }
  if (dataLength == 0) {
    return;
  }
  if (dataLength < -1) {
    return;
  }
  pcStack_28 = codepage;
  codepage_local._4_4_ = dataLength;
  pcStack_18 = codepageData;
  codepageData_local = (char *)this;
  if (dataLength == -1) {
    sVar3 = strlen(codepageData);
    codepage_local._4_4_ = (int32_t)sVar3;
  }
  converter._4_4_ = U_ZERO_ERROR;
  if (pcStack_28 != (char *)0x0) {
    if (*pcStack_28 == '\0') {
      UVar2 = cloneArrayIfNeeded(this,codepage_local._4_4_,codepage_local._4_4_,'\0',(int32_t **)0x0
                                 ,'\0');
      cs = pcStack_18;
      if (UVar2 != '\0') {
        us = getArrayStart(this);
        u_charsToUChars_63(cs,us,codepage_local._4_4_);
        setLength(this,codepage_local._4_4_);
        return;
      }
      setToBogus(this);
      return;
    }
    defaultName = (char *)ucnv_open_63(pcStack_28,(UErrorCode *)((long)&converter + 4));
    goto LAB_0048a56a;
  }
  local_40 = ucnv_getDefaultName_63();
  if (*local_40 == 'U') {
    if ((local_40[1] == 'T') && (local_40[2] == 'F')) {
LAB_0048a47d:
      if (local_40[3] == '-') {
        if (local_40[4] == '8') {
          cVar1 = local_40[5];
joined_r0x0048a4be:
          if (cVar1 == '\0') {
            StringPiece::StringPiece((StringPiece *)local_50,pcStack_18,codepage_local._4_4_);
            utf8._12_4_ = 0;
            utf8.ptr_ = (char *)local_50._0_8_;
            utf8.length_ = local_50._8_4_;
            setToUTF8(this,utf8);
            return;
          }
        }
      }
      else if (local_40[3] == '8') {
        cVar1 = local_40[4];
        goto joined_r0x0048a4be;
      }
    }
  }
  else if (((*local_40 == 'u') && (local_40[1] == 't')) && (local_40[2] == 'f')) goto LAB_0048a47d;
  defaultName = (char *)u_getDefaultConverter_63((UErrorCode *)((long)&converter + 4));
LAB_0048a56a:
  UVar2 = ::U_FAILURE(converter._4_4_);
  if (UVar2 == '\0') {
    doCodepageCreate(this,pcStack_18,codepage_local._4_4_,(UConverter *)defaultName,
                     (UErrorCode *)((long)&converter + 4));
    UVar2 = ::U_FAILURE(converter._4_4_);
    if (UVar2 != '\0') {
      setToBogus(this);
    }
    if (pcStack_28 == (char *)0x0) {
      u_releaseDefaultConverter_63((UConverter *)defaultName);
    }
    else {
      ucnv_close_63((UConverter *)defaultName);
    }
  }
  else {
    setToBogus(this);
  }
  return;
}

Assistant:

void
UnicodeString::doCodepageCreate(const char *codepageData,
                                int32_t dataLength,
                                const char *codepage)
{
    // if there's nothing to convert, do nothing
    if(codepageData == 0 || dataLength == 0 || dataLength < -1) {
        return;
    }
    if(dataLength == -1) {
        dataLength = (int32_t)uprv_strlen(codepageData);
    }

    UErrorCode status = U_ZERO_ERROR;

    // create the converter
    // if the codepage is the default, use our cache
    // if it is an empty string, then use the "invariant character" conversion
    UConverter *converter;
    if (codepage == 0) {
        const char *defaultName = ucnv_getDefaultName();
        if(UCNV_FAST_IS_UTF8(defaultName)) {
            setToUTF8(StringPiece(codepageData, dataLength));
            return;
        }
        converter = u_getDefaultConverter(&status);
    } else if(*codepage == 0) {
        // use the "invariant characters" conversion
        if(cloneArrayIfNeeded(dataLength, dataLength, FALSE)) {
            u_charsToUChars(codepageData, getArrayStart(), dataLength);
            setLength(dataLength);
        } else {
            setToBogus();
        }
        return;
    } else {
        converter = ucnv_open(codepage, &status);
    }

    // if we failed, set the appropriate flags and return
    if(U_FAILURE(status)) {
        setToBogus();
        return;
    }

    // perform the conversion
    doCodepageCreate(codepageData, dataLength, converter, status);
    if(U_FAILURE(status)) {
        setToBogus();
    }

    // close the converter
    if(codepage == 0) {
        u_releaseDefaultConverter(converter);
    } else {
        ucnv_close(converter);
    }
}